

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_new_list3(lyd_node *parent,lys_module *module,char *name,char **key_values,
                    uint32_t *value_lengths,uint32_t options,lyd_node **node)

{
  long lVar1;
  bool bVar2;
  ulong local_f8;
  char *local_f0;
  lysc_node *local_e0;
  ly_ctx *local_d0;
  ly_ctx *local_c8;
  long local_c0;
  long local_b0;
  long local_a8;
  ly_ctx *local_a0;
  ly_ctx *local_98;
  ly_ctx *local_90;
  LY_ERR ret___1;
  LY_ERR ret__;
  LY_VALUE_FORMAT format;
  uint uStack_70;
  ly_bool store_only;
  LY_ERR rc;
  uint32_t i;
  uint32_t key_len;
  void *key_val;
  ly_ctx *ctx;
  lysc_node *key_s;
  lyd_node *key;
  lyd_node *ret;
  uint32_t *puStack_38;
  uint32_t options_local;
  uint32_t *value_lengths_local;
  char **key_values_local;
  char *name_local;
  lys_module *module_local;
  lyd_node *parent_local;
  
  key = (lyd_node *)0x0;
  if (parent == (lyd_node *)0x0) {
    if (module == (lys_module *)0x0) {
      local_a0 = (ly_ctx *)0x0;
    }
    else {
      local_a0 = module->ctx;
    }
    local_98 = local_a0;
  }
  else {
    if (parent->schema == (lysc_node *)0x0) {
      local_90 = (ly_ctx *)parent[2].schema;
    }
    else {
      local_90 = parent->schema->module->ctx;
    }
    local_98 = local_90;
  }
  key_val = local_98;
  format = LY_VALUE_CANON;
  ret__._3_1_ = (options & 2) != 0;
  ret._4_4_ = options;
  puStack_38 = value_lengths;
  value_lengths_local = (uint32_t *)key_values;
  key_values_local = (char **)name;
  name_local = (char *)module;
  module_local = (lys_module *)parent;
  parent_local._4_4_ = lyd_new_val_get_format(options,&ret___1);
  if (parent_local._4_4_ == LY_VALUE_CANON) {
    if ((module_local == (lys_module *)0x0) && (name_local == (char *)0x0)) {
      ly_log((ly_ctx *)key_val,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","parent || module",
             "lyd_new_list3");
      parent_local._4_4_ = LY_VALUE_XML;
    }
    else if ((module_local == (lys_module *)0x0) && (node == (lyd_node **)0x0)) {
      ly_log((ly_ctx *)key_val,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","parent || node",
             "lyd_new_list3");
      parent_local._4_4_ = LY_VALUE_XML;
    }
    else if (key_values_local == (char **)0x0) {
      ly_log((ly_ctx *)key_val,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","name",
             "lyd_new_list3");
      parent_local._4_4_ = LY_VALUE_XML;
    }
    else if ((ret___1 == LY_ENOTFOUND) && (puStack_38 == (uint32_t *)0x0)) {
      ly_log((ly_ctx *)key_val,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",
             "(format != LY_VALUE_LYB) || value_lengths","lyd_new_list3");
      parent_local._4_4_ = LY_VALUE_XML;
    }
    else {
      if (module_local != (lys_module *)0x0) {
        if (module_local->name == (char *)0x0) {
          lVar1._0_1_ = module_local->implemented;
          lVar1._1_1_ = module_local->to_compile;
          lVar1._2_1_ = module_local->latest_revision;
          lVar1._3_5_ = *(undefined5 *)&module_local->field_0x7b;
        }
        else {
          lVar1 = **(long **)(module_local->name + 8);
        }
        if (((lVar1 != 0) && (name_local != (char *)0x0)) && (*(long *)name_local != 0)) {
          if (module_local == (lys_module *)0x0) {
            local_b0 = 0;
          }
          else {
            if (module_local->name == (char *)0x0) {
              local_a8._0_1_ = module_local->implemented;
              local_a8._1_1_ = module_local->to_compile;
              local_a8._2_1_ = module_local->latest_revision;
              local_a8._3_5_ = *(undefined5 *)&module_local->field_0x7b;
            }
            else {
              local_a8 = **(long **)(module_local->name + 8);
            }
            local_b0 = local_a8;
          }
          if (name_local == (char *)0x0) {
            local_c0 = 0;
          }
          else {
            local_c0 = *(long *)name_local;
          }
          if (local_b0 != local_c0) {
            if (module_local == (lys_module *)0x0) {
              local_d0 = (ly_ctx *)0x0;
            }
            else {
              if (module_local->name == (char *)0x0) {
                local_c8 = *(ly_ctx **)&module_local->implemented;
              }
              else {
                local_c8 = (ly_ctx *)**(undefined8 **)(module_local->name + 8);
              }
              local_d0 = local_c8;
            }
            ly_log(local_d0,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call."
                  );
            return LY_EINVAL;
          }
        }
      }
      if ((ret__._3_1_ == LY_SUCCESS >> 0x18) ||
         ((ret___1 != LY_SUCCESS && (ret___1 != LY_ENOTFOUND)))) {
        parent_local._4_4_ =
             _lyd_new_list_node((ly_ctx *)key_val,(lyd_node *)module_local,(lys_module *)name_local,
                                (char *)key_values_local,ret._4_4_,&key);
        if (parent_local._4_4_ == LY_VALUE_CANON) {
          if (((key->schema->flags & 0x200) == 0) && (value_lengths_local == (uint32_t *)0x0)) {
            if (key->schema == (lysc_node *)0x0) {
              local_e0 = key[1].schema;
            }
            else {
              local_e0 = (lysc_node *)key->schema->name;
            }
            ly_log((ly_ctx *)key_val,LY_LLERR,LY_EINVAL,"Missing list \"%s\" keys.",local_e0);
            format = LY_VALUE_XML;
          }
          else {
            uStack_70 = 0;
            ctx = (ly_ctx *)lysc_node_child(key->schema);
            while( true ) {
              bVar2 = false;
              if (ctx != (ly_ctx *)0x0) {
                bVar2 = ((ulong)(ctx->dict).hash_tab & 0x1000000) != 0;
              }
              if (!bVar2) break;
              if (*(long *)(value_lengths_local + (ulong)uStack_70 * 2) == 0) {
                local_f0 = "";
              }
              else {
                local_f0 = *(char **)(value_lengths_local + (ulong)uStack_70 * 2);
              }
              _i = local_f0;
              if (puStack_38 == (uint32_t *)0x0) {
                local_f8 = strlen(local_f0);
              }
              else {
                local_f8 = (ulong)puStack_38[uStack_70];
              }
              rc = (LY_ERR)local_f8;
              format = lyd_create_term((lysc_node *)ctx,_i,local_f8 & 0xffffffff,'\0',ret__._3_1_,
                                       (ly_bool *)0x0,ret___1,(void *)0x0,0x3f3,(ly_bool *)0x0,
                                       (lyd_node **)&key_s);
              if (format != LY_VALUE_CANON) goto LAB_00140816;
              lyd_insert_node(key,(lyd_node **)0x0,(lyd_node *)key_s,1);
              uStack_70 = uStack_70 + 1;
              ctx = *(ly_ctx **)((long)&(ctx->dict).lock + 0x10);
            }
            if (module_local != (lys_module *)0x0) {
              lyd_insert_node((lyd_node *)module_local,(lyd_node **)0x0,key,0);
            }
          }
LAB_00140816:
          if (format == LY_VALUE_CANON) {
            if (node != (lyd_node **)0x0) {
              *node = key;
            }
          }
          else {
            lyd_free_tree(key);
          }
          parent_local._4_4_ = format;
        }
      }
      else {
        ly_log((ly_ctx *)key_val,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",
               "!(store_only && (format == LY_VALUE_CANON || format == LY_VALUE_LYB))",
               "lyd_new_list3");
        parent_local._4_4_ = LY_VALUE_XML;
      }
    }
  }
  return parent_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_list3(struct lyd_node *parent, const struct lys_module *module, const char *name, const char **key_values,
        uint32_t *value_lengths, uint32_t options, struct lyd_node **node)
{
    struct lyd_node *ret = NULL, *key;
    const struct lysc_node *key_s;
    const struct ly_ctx *ctx = parent ? LYD_CTX(parent) : (module ? module->ctx : NULL);
    const void *key_val;
    uint32_t key_len, i;
    LY_ERR rc = LY_SUCCESS;
    ly_bool store_only = (options & LYD_NEW_VAL_STORE_ONLY) ? 1 : 0;
    LY_VALUE_FORMAT format;

    LY_CHECK_RET(lyd_new_val_get_format(options, &format));
    LY_CHECK_ARG_RET(ctx, parent || module, parent || node, name, (format != LY_VALUE_LYB) || value_lengths, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(parent ? LYD_CTX(parent) : NULL, module ? module->ctx : NULL, LY_EINVAL);
    LY_CHECK_ARG_RET(ctx, !(store_only && (format == LY_VALUE_CANON || format == LY_VALUE_LYB)), LY_EINVAL);

    /* create the list node */
    LY_CHECK_RET(_lyd_new_list_node(ctx, parent, module, name, options, &ret));

    if (!(ret->schema->flags & LYS_KEYLESS) && !key_values) {
        LOGERR(ctx, LY_EINVAL, "Missing list \"%s\" keys.", LYD_NAME(ret));
        rc = LY_EINVAL;
        goto cleanup;
    }

    /* create and insert all the keys */
    i = 0;
    for (key_s = lysc_node_child(ret->schema); key_s && (key_s->flags & LYS_KEY); key_s = key_s->next) {
        key_val = key_values[i] ? key_values[i] : "";
        key_len = value_lengths ? value_lengths[i] : strlen(key_val);

        rc = lyd_create_term(key_s, key_val, key_len, 0, store_only, NULL, format, NULL, LYD_HINT_DATA, NULL, &key);
        LY_CHECK_GOTO(rc, cleanup);
        lyd_insert_node(ret, NULL, key, LYD_INSERT_NODE_LAST);
        ++i;
    }

    if (parent) {
        lyd_insert_node(parent, NULL, ret, LYD_INSERT_NODE_DEFAULT);
    }

cleanup:
    if (rc) {
        lyd_free_tree(ret);
        ret = NULL;
    } else if (node) {
        *node = ret;
    }
    return rc;
}